

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseFlopStandard(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Ver_Stream_t *p_00;
  char cVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pNetLI;
  char Symbol;
  char *pWord;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNetLo;
  Abc_Obj_t *pNetLi;
  Ver_Stream_t *p;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  p_00 = pMan->pReader;
  iVar2 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if (iVar2 == 0) {
    pMan_local._4_4_ = 0;
  }
  else {
    cVar1 = Ver_StreamPopChar(p_00);
    if (cVar1 == '(') {
      Ver_ParseSkipComments(pMan);
      pcVar3 = Ver_ParseGetName(pMan);
      if (pcVar3 == (char *)0x0) {
        pMan_local._4_4_ = 0;
      }
      else {
        pAVar4 = Ver_ParseFindNet(pNtk,pcVar3);
        if (pAVar4 == (Abc_Obj_t *)0x0) {
          sprintf(pMan->sError,"Net is missing in gate %s.",pcVar3);
          Ver_ParsePrintErrorMessage(pMan);
          pMan_local._4_4_ = 0;
        }
        else {
          Ver_ParseSkipComments(pMan);
          cVar1 = Ver_StreamPopChar(p_00);
          if (cVar1 == ')') {
            sprintf(pMan->sError,"Cannot parse the flop.");
            Ver_ParsePrintErrorMessage(pMan);
            pMan_local._4_4_ = 0;
          }
          else if (cVar1 == ',') {
            Ver_ParseSkipComments(pMan);
            pcVar3 = Ver_ParseGetName(pMan);
            if (pcVar3 == (char *)0x0) {
              pMan_local._4_4_ = 0;
            }
            else {
              pNetLI = Ver_ParseFindNet(pNtk,pcVar3);
              if (pNetLI == (Abc_Obj_t *)0x0) {
                sprintf(pMan->sError,"Net is missing in gate %s.",pcVar3);
                Ver_ParsePrintErrorMessage(pMan);
                pMan_local._4_4_ = 0;
              }
              else {
                Ver_ParseSkipComments(pMan);
                cVar1 = Ver_StreamPopChar(p_00);
                if (cVar1 == ')') {
                  Ver_ParseSkipComments(pMan);
                  cVar1 = Ver_StreamPopChar(p_00);
                  if (cVar1 == ';') {
                    pAVar4 = Ver_ParseCreateLatch(pNtk,pNetLI,pAVar4);
                    Abc_LatchSetInit0(pAVar4);
                    pMan_local._4_4_ = 1;
                  }
                  else {
                    sprintf(pMan->sError,"Cannot parse the flop.");
                    Ver_ParsePrintErrorMessage(pMan);
                    pMan_local._4_4_ = 0;
                  }
                }
                else {
                  sprintf(pMan->sError,"Cannot parse the flop.");
                  Ver_ParsePrintErrorMessage(pMan);
                  pMan_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            sprintf(pMan->sError,"Cannot parse the flop.");
            Ver_ParsePrintErrorMessage(pMan);
            pMan_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      sprintf(pMan->sError,"Cannot parse a standard gate (expected opening parenthesis).");
      Ver_ParsePrintErrorMessage(pMan);
      pMan_local._4_4_ = 0;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseFlopStandard( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNetLi, * pNetLo, * pLatch;
    char * pWord, Symbol;

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;

    // this is gate name - throw it away
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse a standard gate (expected opening parenthesis)." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // parse the output name
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // get the net corresponding to this output
    pNetLo = Ver_ParseFindNet( pNtk, pWord );
    if ( pNetLo == NULL )
    {
        sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    Symbol = Ver_StreamPopChar(p);
    if ( Symbol == ')' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    // skip comma
    if ( Symbol != ',' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // parse the output name
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // get the net corresponding to this output
    pNetLi = Ver_ParseFindNet( pNtk, pWord );
    if ( pNetLi == NULL )
    {
        sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    Symbol = Ver_StreamPopChar(p);
    if ( Symbol != ')' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot parse the flop." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // create the latch
    pLatch = Ver_ParseCreateLatch( pNtk, pNetLi, pNetLo );
    Abc_LatchSetInit0( pLatch );
    return 1;
}